

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFPageDocumentHelper::flattenAnnotationsForPage
          (QPDFPageDocumentHelper *this,QPDFPageObjectHelper *page,QPDFObjectHandle *resources,
          QPDFAcroFormDocumentHelper *afdh,int required_flags,int forbidden_flags)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  QPDF *this_01;
  string *psVar1;
  bool bVar2;
  longlong lVar3;
  reference which;
  ulong uVar4;
  size_type sVar5;
  size_type sVar6;
  byte local_5c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  QPDFObjectHandle local_4f0;
  allocator<char> local_4d9;
  string local_4d8 [32];
  QPDFObjectHandle local_4b8;
  allocator<char> local_4a1;
  string local_4a0;
  QPDFObjectHandle local_480;
  QPDFObjGen local_470;
  undefined1 local_468 [8];
  QPDFObjectHandle new_annots_oh;
  string local_450 [32];
  undefined1 local_430 [8];
  QPDFObjectHandle old_annots;
  string local_418;
  QPDFObjectHandle page_oh;
  undefined1 local_3d0 [24];
  string local_3b8 [32];
  QPDFObjectHandle local_398;
  QPDFObjectHandle local_388;
  undefined1 local_378 [8];
  string content;
  string local_350;
  undefined1 local_330 [8];
  string name;
  string local_2f8 [32];
  string local_2d8;
  QPDFObjectHandle local_2b8;
  allocator<char> local_2a1;
  string local_2a0;
  QPDFObjectHandle local_280;
  allocator<char> local_269;
  string local_268 [32];
  undefined1 local_248 [24];
  QPDFObjectHandle as_resources;
  undefined1 local_1f0 [8];
  QPDFFormFieldObjectHelper ff;
  undefined1 local_1b0 [7];
  bool process;
  byte local_18a;
  allocator<char> local_189;
  string local_188 [6];
  bool is_widget;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [8];
  QPDFObjectHandle as;
  QPDFAnnotationObjectHelper *aoh;
  iterator __end1;
  iterator __begin1;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *__range1;
  int next_fx;
  QPDFObjectHandle rotate_obj;
  undefined1 local_c0 [4];
  int rotate;
  string new_content;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> annots;
  bool need_appearances;
  int forbidden_flags_local;
  int required_flags_local;
  QPDFAcroFormDocumentHelper *afdh_local;
  QPDFObjectHandle *resources_local;
  QPDFPageObjectHelper *page_local;
  QPDFPageDocumentHelper *this_local;
  
  annots.super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       QPDFAcroFormDocumentHelper::getNeedAppearances(afdh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  QPDFPageObjectHelper::getAnnotations
            ((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
             local_50,page,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             ((long)&new_content.field_2 + 8));
  std::__cxx11::string::string((string *)local_c0);
  rotate_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 0;
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&stack0xffffffffffffff18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&next_fx,"/Rotate",(allocator<char> *)((long)&__range1 + 7));
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)&stack0xffffffffffffff28,(string *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string((string *)&next_fx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff18);
  bVar2 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&stack0xffffffffffffff28);
  if ((bVar2) &&
     (lVar3 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&stack0xffffffffffffff28),
     lVar3 != 0)) {
    rotate_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ =
         QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&stack0xffffffffffffff28);
  }
  __range1._0_4_ = 1;
  __end1 = std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
           begin((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                 local_50);
  aoh = (QPDFAnnotationObjectHelper *)
        std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::end
                  ((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                    *)local_50);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                                     *)&aoh), bVar2) {
    which = __gnu_cxx::
            __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
            ::operator*(&__end1);
    as.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)which;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"/N",&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_188,"",&local_189);
    QPDFAnnotationObjectHelper::getAppearanceStream
              ((QPDFAnnotationObjectHelper *)local_140,(string *)which,&local_160);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator(&local_189);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    QPDFAnnotationObjectHelper::getSubtype_abi_cxx11_
              ((string *)local_1b0,
               (QPDFAnnotationObjectHelper *)
               as.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0,"/Widget");
    std::__cxx11::string::~string((string *)local_1b0);
    ff.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 1;
    local_18a = bVar2;
    if (((annots.
          super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) && (bVar2)) {
      QTC::TC("qpdf","QPDFPageDocumentHelper skip widget need appearances",0);
      ff.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 0;
    }
    if ((ff.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ == 0) ||
       (bVar2 = QPDFObjectHandle::isStream((QPDFObjectHandle *)local_140), !bVar2)) {
      local_5c1 = 0;
      if ((ff.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._7_1_ & 1) != 0) {
        QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)local_3d0)
        ;
        bVar2 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_3d0);
        local_5c1 = bVar2 ^ 0xff;
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_3d0);
      }
      if ((local_5c1 & 1) == 0) {
        QPDFObjectHelper::getObjectHandle
                  ((QPDFObjectHelper *)
                   &page_oh.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                   ((long)&new_content.field_2 + 8),
                   (value_type *)
                   &page_oh.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &page_oh.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        QTC::TC("qpdf","QPDFPageDocumentHelper ignore annotation with no appearance",0);
      }
    }
    else {
      if ((local_18a & 1) == 0) {
        QTC::TC("qpdf","QPDFPageDocumentHelper non-widget annotation",0);
      }
      else {
        QTC::TC("qpdf","QPDFPageDocumentHelper merge DR",0);
        this_00 = &as_resources.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper
                  ((QPDFAnnotationObjectHelper *)this_00,
                   (QPDFAnnotationObjectHelper *)
                   as.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        QPDFAcroFormDocumentHelper::getFieldForAnnotation
                  ((QPDFFormFieldObjectHelper *)local_1f0,afdh,(QPDFAnnotationObjectHelper *)this_00
                  );
        QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper
                  ((QPDFAnnotationObjectHelper *)
                   &as_resources.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::getDict((QPDFObjectHandle *)local_248);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_268,"/Resources",&local_269);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_248 + 0x10),(string *)local_248);
        std::__cxx11::string::~string(local_268);
        std::allocator<char>::~allocator(&local_269);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_248);
        bVar2 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)(local_248 + 0x10));
        if (bVar2) {
          QTC::TC("qpdf","QPDFPageDocumentHelper indirect as resources",0);
          QPDFObjectHandle::getDict(&local_280);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a0,"/Resources",&local_2a1);
          QPDFObjectHandle::shallowCopy(&local_2b8);
          QPDFObjectHandle::replaceKey(&local_280,&local_2a0,&local_2b8);
          QPDFObjectHandle::~QPDFObjectHandle(&local_2b8);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::allocator<char>::~allocator(&local_2a1);
          QPDFObjectHandle::~QPDFObjectHandle(&local_280);
          QPDFObjectHandle::getDict((QPDFObjectHandle *)&local_2d8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_2f8,"/Resources",(allocator<char> *)&stack0xfffffffffffffd07);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_2d8.field_2,&local_2d8);
          QPDFObjectHandle::operator=
                    ((QPDFObjectHandle *)(local_248 + 0x10),(QPDFObjectHandle *)&local_2d8.field_2);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_2d8.field_2);
          std::__cxx11::string::~string(local_2f8);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd07);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_2d8);
        }
        QPDFFormFieldObjectHelper::getDefaultResources
                  ((QPDFFormFieldObjectHelper *)((long)&name.field_2 + 8));
        QPDFObjectHandle::mergeResources
                  ((QPDFObjectHandle *)(local_248 + 0x10),
                   (QPDFObjectHandle *)((long)&name.field_2 + 8),
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)0x0);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)((long)&name.field_2 + 8));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_248 + 0x10));
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)local_1f0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"/Fxo",(allocator<char> *)(content.field_2._M_local_buf + 0xf)
                );
      QPDFObjectHandle::getUniqueResourceName
                ((string *)local_330,resources,&local_350,(int *)&__range1,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator((allocator<char> *)(content.field_2._M_local_buf + 0xf));
      QPDFAnnotationObjectHelper::getPageContentForAppearance
                ((string *)local_378,
                 (QPDFAnnotationObjectHelper *)
                 as.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi,(string *)local_330,
                 rotate_obj.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_,
                 required_flags,forbidden_flags);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        operator____qpdf((char *)&local_388,0x41906b);
        QPDFObjectHandle::mergeResources
                  (resources,&local_388,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)0x0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_388);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_3b8,"/XObject",(allocator<char> *)(local_3d0 + 0x17));
        QPDFObjectHandle::getKey(&local_398,(string *)resources);
        QPDFObjectHandle::replaceKey(&local_398,(string *)local_330,(QPDFObjectHandle *)local_140);
        QPDFObjectHandle::~QPDFObjectHandle(&local_398);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)(local_3d0 + 0x17));
        __range1._0_4_ = (int)__range1 + 1;
      }
      std::__cxx11::string::operator+=((string *)local_c0,(string *)local_378);
      std::__cxx11::string::~string((string *)local_378);
      std::__cxx11::string::~string((string *)local_330);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_140);
    __gnu_cxx::
    __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
    ::operator++(&__end1);
  }
  sVar5 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                     ((long)&new_content.field_2 + 8));
  sVar6 = std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::size
                    ((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                      *)local_50);
  if (sVar5 != sVar6) {
    QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&stack0xfffffffffffffc08);
    bVar2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::empty
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                       ((long)&new_content.field_2 + 8));
    if (bVar2) {
      QTC::TC("qpdf","QPDFPageDocumentHelper remove annots",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_418,"/Annots",
                 (allocator<char> *)
                 ((long)&old_annots.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)&stack0xfffffffffffffc08,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&old_annots.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_450,"/Annots",
                 (allocator<char> *)
                 ((long)&new_annots_oh.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_430,(string *)&stack0xfffffffffffffc08);
      std::__cxx11::string::~string(local_450);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&new_annots_oh.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::newArray
                ((QPDFObjectHandle *)local_468,
                 (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                 ((long)&new_content.field_2 + 8));
      bVar2 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_430);
      if (bVar2) {
        QTC::TC("qpdf","QPDFPageDocumentHelper replace indirect annots",0);
        this_01 = (this->super_QPDFDocumentHelper).qpdf;
        local_470 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_430);
        QPDFObjectHandle::QPDFObjectHandle(&local_480,(QPDFObjectHandle *)local_468);
        QPDF::replaceObject(this_01,local_470,&local_480);
        QPDFObjectHandle::~QPDFObjectHandle(&local_480);
      }
      else {
        QTC::TC("qpdf","QPDFPageDocumentHelper replace direct annots",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a0,"/Annots",&local_4a1);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)&stack0xfffffffffffffc08,&local_4a0,
                   (QPDFObjectHandle *)local_468);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::allocator<char>::~allocator(&local_4a1);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_468);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_430);
    }
    psVar1 = (string *)(this->super_QPDFDocumentHelper).qpdf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4d8,"q\n",&local_4d9);
    QPDF::newStream((QPDF *)&local_4b8,psVar1);
    QPDFPageObjectHelper::addPageContents(page,&local_4b8,true);
    QPDFObjectHandle::~QPDFObjectHandle(&local_4b8);
    std::__cxx11::string::~string(local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    psVar1 = (string *)(this->super_QPDFDocumentHelper).qpdf;
    std::operator+(&local_510,"\nQ\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    QPDF::newStream((QPDF *)&local_4f0,psVar1);
    QPDFPageObjectHelper::addPageContents(page,&local_4f0,false);
    QPDFObjectHandle::~QPDFObjectHandle(&local_4f0);
    std::__cxx11::string::~string((string *)&local_510);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffc08);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff28);
  std::__cxx11::string::~string((string *)local_c0);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
             ((long)&new_content.field_2 + 8));
  std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
            ((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
             local_50);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::flattenAnnotationsForPage(
    QPDFPageObjectHelper& page,
    QPDFObjectHandle& resources,
    QPDFAcroFormDocumentHelper& afdh,
    int required_flags,
    int forbidden_flags)
{
    bool need_appearances = afdh.getNeedAppearances();
    std::vector<QPDFAnnotationObjectHelper> annots = page.getAnnotations();
    std::vector<QPDFObjectHandle> new_annots;
    std::string new_content;
    int rotate = 0;
    QPDFObjectHandle rotate_obj = page.getObjectHandle().getKey("/Rotate");
    if (rotate_obj.isInteger() && rotate_obj.getIntValue()) {
        rotate = rotate_obj.getIntValueAsInt();
    }
    int next_fx = 1;
    for (auto& aoh: annots) {
        QPDFObjectHandle as = aoh.getAppearanceStream("/N");
        bool is_widget = (aoh.getSubtype() == "/Widget");
        bool process = true;
        if (need_appearances && is_widget) {
            QTC::TC("qpdf", "QPDFPageDocumentHelper skip widget need appearances");
            process = false;
        }
        if (process && as.isStream()) {
            if (is_widget) {
                QTC::TC("qpdf", "QPDFPageDocumentHelper merge DR");
                QPDFFormFieldObjectHelper ff = afdh.getFieldForAnnotation(aoh);
                QPDFObjectHandle as_resources = as.getDict().getKey("/Resources");
                if (as_resources.isIndirect()) {
                    QTC::TC("qpdf", "QPDFPageDocumentHelper indirect as resources");
                    as.getDict().replaceKey("/Resources", as_resources.shallowCopy());
                    as_resources = as.getDict().getKey("/Resources");
                }
                as_resources.mergeResources(ff.getDefaultResources());
            } else {
                QTC::TC("qpdf", "QPDFPageDocumentHelper non-widget annotation");
            }
            std::string name = resources.getUniqueResourceName("/Fxo", next_fx);
            std::string content =
                aoh.getPageContentForAppearance(name, rotate, required_flags, forbidden_flags);
            if (!content.empty()) {
                resources.mergeResources("<< /XObject << >> >>"_qpdf);
                resources.getKey("/XObject").replaceKey(name, as);
                ++next_fx;
            }
            new_content += content;
        } else if (process && !aoh.getAppearanceDictionary().isNull()) {
            // If an annotation has no selected appearance stream, just drop the annotation when
            // flattening. This can happen for unchecked checkboxes and radio buttons, popup windows
            // associated with comments that aren't visible, and other types of annotations that
            // aren't visible. Annotations that have no appearance streams at all, such as Link,
            // Popup, and Projection, should be preserved.
            QTC::TC("qpdf", "QPDFPageDocumentHelper ignore annotation with no appearance");
        } else {
            new_annots.push_back(aoh.getObjectHandle());
        }
    }
    if (new_annots.size() != annots.size()) {
        QPDFObjectHandle page_oh = page.getObjectHandle();
        if (new_annots.empty()) {
            QTC::TC("qpdf", "QPDFPageDocumentHelper remove annots");
            page_oh.removeKey("/Annots");
        } else {
            QPDFObjectHandle old_annots = page_oh.getKey("/Annots");
            QPDFObjectHandle new_annots_oh = QPDFObjectHandle::newArray(new_annots);
            if (old_annots.isIndirect()) {
                QTC::TC("qpdf", "QPDFPageDocumentHelper replace indirect annots");
                this->qpdf.replaceObject(old_annots.getObjGen(), new_annots_oh);
            } else {
                QTC::TC("qpdf", "QPDFPageDocumentHelper replace direct annots");
                page_oh.replaceKey("/Annots", new_annots_oh);
            }
        }
        page.addPageContents(qpdf.newStream("q\n"), true);
        page.addPageContents(qpdf.newStream("\nQ\n" + new_content), false);
    }
}